

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O1

void __thiscall
Assimp::ValidateDSProcess::Validate
          (ValidateDSProcess *this,aiAnimation *pAnimation,aiMeshMorphAnim *pMeshMorphAnim)

{
  double dVar1;
  double dVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  
  Validate(this,&pMeshMorphAnim->mName);
  if (pMeshMorphAnim->mNumKeys == 0) {
    ReportError(this,"Empty mesh morph animation channel");
  }
  if (pMeshMorphAnim->mKeys != (aiMeshMorphKey *)0x0) {
    if (pMeshMorphAnim->mNumKeys != 0) {
      dVar5 = -100000000000.0;
      lVar3 = 0;
      uVar4 = 0;
      do {
        dVar1 = pAnimation->mDuration;
        if (0.0 < dVar1) {
          dVar2 = *(double *)((long)&pMeshMorphAnim->mKeys->mTime + lVar3);
          if (dVar1 + 0.001 < dVar2) {
            ReportError(this,
                        "aiMeshMorphAnim::mKeys[%i].mTime (%.5f) is larger than aiAnimation::mDuration (which is %.5f)"
                        ,(double)(float)dVar2,(double)(float)dVar1,uVar4 & 0xffffffff);
          }
        }
        if ((uVar4 != 0) &&
           (dVar1 = *(double *)((long)&pMeshMorphAnim->mKeys->mTime + lVar3), dVar1 <= dVar5)) {
          ReportWarning(this,
                        "aiMeshMorphAnim::mKeys[%i].mTime (%.5f) is smaller than aiMeshMorphAnim::mKeys[%i] (which is %.5f)"
                        ,(double)(float)dVar1,(double)(float)dVar5,uVar4 & 0xffffffff,
                        (ulong)((int)uVar4 - 1));
        }
        dVar5 = *(double *)((long)&pMeshMorphAnim->mKeys->mTime + lVar3);
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x20;
      } while (uVar4 < pMeshMorphAnim->mNumKeys);
    }
    return;
  }
  ReportError(this,"aiMeshMorphAnim::mKeys is NULL (aiMeshMorphAnim::mNumKeys is %i)");
}

Assistant:

void ValidateDSProcess::Validate( const aiAnimation* pAnimation,
     const aiMeshMorphAnim* pMeshMorphAnim)
{
    Validate(&pMeshMorphAnim->mName);

    if (!pMeshMorphAnim->mNumKeys) {
        ReportError("Empty mesh morph animation channel");
    }

    // otherwise check whether one of the keys exceeds the total duration of the animation
    if (pMeshMorphAnim->mNumKeys)
    {
        if (!pMeshMorphAnim->mKeys)
        {
            ReportError("aiMeshMorphAnim::mKeys is NULL (aiMeshMorphAnim::mNumKeys is %i)",
                pMeshMorphAnim->mNumKeys);
        }
        double dLast = -10e10;
        for (unsigned int i = 0; i < pMeshMorphAnim->mNumKeys;++i)
        {
            // ScenePreprocessor will compute the duration if still the default value
            // (Aramis) Add small epsilon, comparison tended to fail if max_time == duration,
            //  seems to be due the compilers register usage/width.
            if (pAnimation->mDuration > 0. && pMeshMorphAnim->mKeys[i].mTime > pAnimation->mDuration+0.001)
            {
                ReportError("aiMeshMorphAnim::mKeys[%i].mTime (%.5f) is larger "
                    "than aiAnimation::mDuration (which is %.5f)",i,
                    (float)pMeshMorphAnim->mKeys[i].mTime,
                    (float)pAnimation->mDuration);
            }
            if (i && pMeshMorphAnim->mKeys[i].mTime <= dLast)
            {
                ReportWarning("aiMeshMorphAnim::mKeys[%i].mTime (%.5f) is smaller "
                    "than aiMeshMorphAnim::mKeys[%i] (which is %.5f)",i,
                    (float)pMeshMorphAnim->mKeys[i].mTime,
                    i-1, (float)dLast);
            }
            dLast = pMeshMorphAnim->mKeys[i].mTime;
        }
    }
}